

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O0

int __thiscall
CLayer::GetWireInOverFlowBoundary
          (CLayer *this,
          hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
          *pWireList)

{
  int iVar1;
  CBoundary *this_00;
  bool bVar2;
  int iVar3;
  CDesign *pCVar4;
  pointer ppVar5;
  iterator iVar6;
  iterator iVar7;
  reference ppCVar8;
  int *piVar9;
  size_type sVar10;
  CWire *local_98;
  __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_> local_90;
  iterator end_1;
  iterator itrw;
  int local_54;
  int iNumOF;
  CBoundary *pBoundary;
  vector<CNet_*,_std::allocator<CNet_*>_> NetList;
  iterator end;
  iterator itr;
  int iReRouting_Step;
  hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
  *pWireList_local;
  CLayer *this_local;
  
  pCVar4 = CObject::GetDesign();
  iVar1 = *(int *)&pCVar4->field_0xc4c;
  end = std::
        multimap<int,_CBoundary_*,_std::less<int>,_std::allocator<std::pair<const_int,_CBoundary_*>_>_>
        ::begin(&this->m_CBoundaryBucket);
  NetList.super__Vector_base<CNet_*,_std::allocator<CNet_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                multimap<int,_CBoundary_*,_std::less<int>,_std::allocator<std::pair<const_int,_CBoundary_*>_>_>
                ::end(&this->m_CBoundaryBucket);
  do {
    bVar2 = std::operator!=(&end,(_Self *)&NetList.
                                           super__Vector_base<CNet_*,_std::allocator<CNet_*>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar2) {
      sVar10 = __gnu_cxx::
               hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
               ::size(pWireList);
      return (int)sVar10;
    }
    std::vector<CNet_*,_std::allocator<CNet_*>_>::vector
              ((vector<CNet_*,_std::allocator<CNet_*>_> *)&pBoundary);
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_CBoundary_*>_>::operator->(&end);
    this_00 = ppVar5->second;
    iVar3 = CBoundary::GetOverFlow(this_00);
    iVar6 = std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&this_00->m_Wire);
    iVar7 = std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&this_00->m_Wire);
    std::
    sort<__gnu_cxx::__normal_iterator<CWire**,std::vector<CWire*,std::allocator<CWire*>>>,CWireOpLen>
              (iVar6._M_current,iVar7._M_current);
    end_1 = std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&this_00->m_Wire);
    local_90._M_current =
         (CWire **)std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&this_00->m_Wire);
    local_54 = iVar3 * iVar1;
    while (bVar2 = __gnu_cxx::operator!=(&end_1,&local_90), bVar2) {
      ppCVar8 = __gnu_cxx::
                __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                operator*(&end_1);
      local_98 = *ppCVar8;
      piVar9 = __gnu_cxx::
               hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
               ::operator[](pWireList,(key_type *)&local_98);
      *piVar9 = *piVar9 + 1;
      if (local_54 == 0) break;
      __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
      operator++(&end_1);
      local_54 = local_54 + -1;
    }
    std::vector<CNet_*,_std::allocator<CNet_*>_>::~vector
              ((vector<CNet_*,_std::allocator<CNet_*>_> *)&pBoundary);
    std::_Rb_tree_iterator<std::pair<const_int,_CBoundary_*>_>::operator++(&end);
  } while( true );
}

Assistant:

int CLayer::GetWireInOverFlowBoundary(hash_map<ADDRESS,int>* pWireList)
{
	int	iReRouting_Step		=	GetDesign()->m_Param.m_iReRouting_Step;
	for(multimap<int, CBoundary*>::iterator itr=m_CBoundaryBucket.begin(),end=m_CBoundaryBucket.end();itr!=end;++itr)
	{
		vector<CNet*>	NetList;
		CBoundary*	pBoundary	=	itr->second;

		int	iNumOF	=	pBoundary->GetOverFlow()*iReRouting_Step;

		sort(pBoundary->m_Wire.begin(),pBoundary->m_Wire.end(),CWireOpLen());
		for(vector<CWire*>::iterator itrw=pBoundary->m_Wire.begin(),end=pBoundary->m_Wire.end();itrw!=end;++itrw)
		{
			++(*pWireList)[(ADDRESS)(*itrw)];
			if(iNumOF--==0)	break;
		}
	}

	return	pWireList->size();
}